

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::CommandLineInterface::MemoryOutputStream::MemoryOutputStream
          (MemoryOutputStream *this,GeneratorContextImpl *directory,string *filename,
          bool append_mode)

{
  pointer pcVar1;
  StringOutputStream *this_00;
  
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__MemoryOutputStream_004dc250;
  this->directory_ = directory;
  (this->filename_)._M_dataplus._M_p = (pointer)&(this->filename_).field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->filename_,pcVar1,pcVar1 + filename->_M_string_length);
  (this->insertion_point_)._M_dataplus._M_p = (pointer)&(this->insertion_point_).field_2;
  (this->insertion_point_)._M_string_length = 0;
  (this->insertion_point_).field_2._M_local_buf[0] = '\0';
  (this->data_)._M_dataplus._M_p = (pointer)&(this->data_).field_2;
  (this->data_)._M_string_length = 0;
  (this->data_).field_2._M_local_buf[0] = '\0';
  this->append_mode_ = append_mode;
  this_00 = (StringOutputStream *)operator_new(0x10);
  io::StringOutputStream::StringOutputStream(this_00,&this->data_);
  (this->inner_)._M_t.
  super___uniq_ptr_impl<google::protobuf::io::StringOutputStream,_std::default_delete<google::protobuf::io::StringOutputStream>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::io::StringOutputStream_*,_std::default_delete<google::protobuf::io::StringOutputStream>_>
  .super__Head_base<0UL,_google::protobuf::io::StringOutputStream_*,_false>._M_head_impl = this_00;
  GeneratedCodeInfo::GeneratedCodeInfo(&this->info_to_insert_,(Arena *)0x0,false);
  return;
}

Assistant:

CommandLineInterface::MemoryOutputStream::MemoryOutputStream(
    GeneratorContextImpl* directory, const std::string& filename,
    bool append_mode)
    : directory_(directory),
      filename_(filename),
      append_mode_(append_mode),
      inner_(new io::StringOutputStream(&data_)) {}